

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

Matrix_t Companion_Mat4(Matrix_t sMatrix)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  float *pfVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  Matrix_t sMatrix_00;
  Matrix_t MVar12;
  float arr [3] [3];
  float local_58 [10];
  
  pfVar1 = (float *)malloc(0x40);
  if (pfVar1 == (float *)0x0) {
    printf("ERROR: Malloc failed!-03");
  }
  else {
    if ((sMatrix._8_4_ & 0xffff) == 0x404) {
      uVar10 = 0;
      do {
        uVar6 = 0;
        do {
          uVar4 = 0;
          pfVar2 = local_58;
          pfVar3 = sMatrix.pMatrix;
          do {
            uVar9 = 0;
            pfVar7 = pfVar2;
            pfVar8 = pfVar3;
            do {
              if (uVar6 != uVar9 && uVar4 != uVar10) {
                if (uVar9 < uVar6) {
                  if (uVar4 < uVar10) {
                    *pfVar7 = *pfVar8;
                  }
                  else {
                    pfVar7[-1] = *pfVar8;
                  }
                }
                else if (uVar4 < uVar10) {
                  pfVar7[-3] = *pfVar8;
                }
                else {
                  pfVar7[-4] = *pfVar8;
                }
              }
              uVar9 = uVar9 + 1;
              pfVar8 = pfVar8 + 4;
              pfVar7 = pfVar7 + 3;
            } while (uVar9 != 4);
            uVar4 = uVar4 + 1;
            pfVar3 = pfVar3 + 1;
            pfVar2 = pfVar2 + 1;
          } while (uVar4 != 4);
          sMatrix_00.row = '\x03';
          sMatrix_00.column = '\x03';
          sMatrix_00._10_6_ = 0;
          sMatrix_00.pMatrix = local_58;
          fVar11 = Det3(sMatrix_00);
          if (((int)uVar10 + (int)uVar6 & 1U) != 0) {
            fVar11 = -fVar11;
          }
          pfVar1[uVar10 * 4 + uVar6] = fVar11;
          uVar6 = uVar6 + 1;
        } while (uVar6 != 4);
        uVar10 = uVar10 + 1;
      } while (uVar10 != 4);
      uVar5 = 0x404;
      goto LAB_0010b215;
    }
    puts("ERROR: Cannot calculate determinant, matrix must be a 4x4 square matrix!");
  }
  pfVar1 = (float *)0x0;
  uVar5 = 0;
LAB_0010b215:
  MVar12.row = (char)uVar5;
  MVar12.column = (char)((ulong)uVar5 >> 8);
  MVar12._10_6_ = (int6)((ulong)uVar5 >> 0x10);
  MVar12.pMatrix = pfVar1;
  return MVar12;
}

Assistant:

Matrix_t Companion_Mat4(Matrix_t sMatrix) //严格意义上讲矩阵是没有代数余子式的，代数余子式属于行列式|A|的元素aij，而非矩阵元素aij
{
	float arr[3][3];
	float *arr_res;
	int i, j, x, y;
	Matrix_t mat_err = {NULL, 0, 0};
	arr_res = (float *)malloc(sizeof(float) * 4 * 4);
	if (arr_res == NULL)
	{
		printf("ERROR: Malloc failed!-03");
		return mat_err;
	}
	if (sMatrix.row == 4 && sMatrix.column == 4) //伴随矩阵用于求矩阵的逆，矩阵有逆的必要条件是矩阵是个方阵
	{
		for (i = 0; i < 4; i++)
		{
			for (j = 0; j < 4; j++)
			{
				for (x = 0; x < 4; x++)
				{
					for (y = 0; y < 4; y++)
					{
						if (x != i)
						{
							if (y != j)
							{
								if (y < j) //选出矩阵的余子式
								{
									if (x < i)
										arr[y][x] = *(sMatrix.pMatrix + y * sMatrix.column + x);
									else
										arr[y][x - 1] = *(sMatrix.pMatrix + y * sMatrix.column + x);
								}
								else
								{
									if (x < i)
										arr[y - 1][x] = *(sMatrix.pMatrix + y * sMatrix.column + x);
									else
										arr[y - 1][x - 1] = *(sMatrix.pMatrix + y * sMatrix.column + x);
								}
							}
						}
					}
				}
				if ((i + j) % 2 == 0) //计算代数余子式的值并将值存放在结果伴随矩阵的相应位置
					*(arr_res + i * 4 + j) = Det3(Arr2Mat(arr[0], 3, 3));
				else
					*(arr_res + i * 4 + j) = (-1) * Det3(Arr2Mat(arr[0], 3, 3));
			}
		}
		return Arr2Mat(arr_res, 4, 4);
	}
	else
	{
		printf("ERROR: Cannot calculate determinant, matrix must be a 4x4 square matrix!\n");
		return mat_err;
	}
}